

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool validateblock(char *s)

{
  char cVar1;
  int local_20;
  int brakdepth;
  int maxbrak;
  char *s_local;
  
  local_20 = 0;
  _brakdepth = s;
  do {
    if (*_brakdepth == '\0') {
      return local_20 == 0;
    }
    cVar1 = *_brakdepth;
    if (cVar1 == '\f') {
      return false;
    }
    if (cVar1 == '\"') {
      _brakdepth = parsestring(_brakdepth + 1);
      if (*_brakdepth != '\"') {
        return false;
      }
    }
    else if (cVar1 == '(') {
LAB_001449a7:
      if (99 < local_20) {
        return false;
      }
      validateblock::brakstack[local_20] = *_brakdepth;
      local_20 = local_20 + 1;
    }
    else if (cVar1 == ')') {
      if ((local_20 < 1) || (local_20 = local_20 + -1, validateblock::brakstack[local_20] != '(')) {
        return false;
      }
    }
    else if (cVar1 == '/') {
      if (_brakdepth[1] == '/') {
        return false;
      }
    }
    else {
      if (cVar1 == '[') goto LAB_001449a7;
      if ((cVar1 == ']') &&
         ((local_20 < 1 || (local_20 = local_20 + -1, validateblock::brakstack[local_20] != '['))))
      {
        return false;
      }
    }
    _brakdepth = _brakdepth + 1;
  } while( true );
}

Assistant:

bool validateblock(const char *s)
{
    const int maxbrak = 100;
    static char brakstack[maxbrak];
    int brakdepth = 0;
    for(; *s; s++) switch(*s)
    {
        case '[': case '(': if(brakdepth >= maxbrak) return false; brakstack[brakdepth++] = *s; break;
        case ']': if(brakdepth <= 0 || brakstack[--brakdepth] != '[') return false; break;
        case ')': if(brakdepth <= 0 || brakstack[--brakdepth] != '(') return false; break;
        case '"': s = parsestring(s + 1); if(*s != '"') return false; break;
        case '/': if(s[1] == '/') return false; break;
        case '\f': return false;
    }
    return brakdepth == 0;
}